

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

uint Abc_HashKey2(Abc_Obj_t *p0,Abc_Obj_t *p1,int TableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  uint Key;
  int TableSize_local;
  Abc_Obj_t *p1_local;
  Abc_Obj_t *p0_local;
  
  pAVar5 = Abc_ObjRegular(p0);
  iVar1 = pAVar5->Id;
  pAVar5 = Abc_ObjRegular(p1);
  iVar2 = pAVar5->Id;
  iVar3 = Abc_ObjIsComplement(p0);
  iVar4 = Abc_ObjIsComplement(p1);
  return (uint)(iVar4 * 0x161 ^ iVar3 * 0x38f ^ iVar2 * 0xb9b ^ iVar1 * 0x1f01) % (uint)TableSize;
}

Assistant:

static unsigned Abc_HashKey2( Abc_Obj_t * p0, Abc_Obj_t * p1, int TableSize ) 
{
    unsigned Key = 0;
    Key ^= Abc_ObjRegular(p0)->Id * 7937;
    Key ^= Abc_ObjRegular(p1)->Id * 2971;
    Key ^= Abc_ObjIsComplement(p0) * 911;
    Key ^= Abc_ObjIsComplement(p1) * 353;
    return Key % TableSize;
}